

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O1

void __thiscall
gl4cts::GLSL420Pack::QualifierOrderBlockTest::prepareShaderSource
          (QualifierOrderBlockTest *this,SHADER_STAGES in_stage,bool in_use_version_400,
          shaderSource *out_source)

{
  pointer psVar1;
  long lVar2;
  ulong uVar3;
  TestError *this_00;
  char *pcVar4;
  qualifierSet *in_qualifiers;
  char *pcVar5;
  size_t position;
  string out_test_decl;
  string out_test_ref;
  string in_test_decl;
  string in_test_ref;
  
  switch(in_stage) {
  case COMPUTE_SHADER:
    goto switchD_009e510c_caseD_0;
  case VERTEX_SHADER:
    pcVar5 = 
    "VERSION\n\nout vec4 vs_tcs_result;\n\nin VARIABLE_DECLARATION;\nout VSOutputBlock {\n    VARIABLE_DECLARATION;\n} output_block;\n\nvoid main()\n{\n    vec4 result = vec4(0, 1, 0, 1);\n\nVERIFICATION\n    vs_tcs_result = result;\n    OUTPUT_VARIABLE_NAME = INPUT_VARIABLE_NAME;\n}\n\n"
    ;
    break;
  case TESS_CTRL_SHADER:
    pcVar5 = 
    "VERSION\n\nlayout(vertices = 1) out;\n\nin  vec4 vs_tcs_result[];\nout vec4 tcs_tes_result[];\n\nin VSOutputBlock {\n    VARIABLE_DECLARATION;\n} input_block [];\nout TCSOutputBlock {\n    VARIABLE_DECLARATION;\n} output_block [];\n\nvoid main()\n{\n    vec4 result = vec4(0, 1, 0, 1);\n\nVERIFICATION    else if (vec4(0, 1, 0, 1) != vs_tcs_result[gl_InvocationID])\n    {\n         result = vec4(1, 0, 0, 1);\n    }\n\n    tcs_tes_result[gl_InvocationID] = result;\n    OUTPUT_VARIABLE_NAME = INPUT_VARIABLE_NAME;\n\n    gl_TessLevelOuter[0] = 1.0;\n    gl_TessLevelOuter[1] = 1.0;\n    gl_TessLevelOuter[2] = 1.0;\n    gl_TessLevelOuter[3] = 1.0;\n    gl_TessLevelInner[0] = 1.0;\n    gl_TessLevelInner[1] = 1.0;\n}\n\n"
    ;
    break;
  case TESS_EVAL_SHADER:
    pcVar5 = 
    "VERSION\n\nlayout(isolines, point_mode) in;\n\nin  vec4 tcs_tes_result[];\nout vec4 tes_gs_result;\n\nin TCSOutputBlock {\n    VARIABLE_DECLARATION;\n} input_block [];\nout TCSOutputBlock {\n    VARIABLE_DECLARATION;\n} output_block;\n\nvoid main()\n{\n    vec4 result = vec4(0, 1, 0, 1);\n\nVERIFICATION    else if (vec4(0, 1, 0, 1) != tcs_tes_result[0])\n    {\n         result = vec4(1, 0, 0, 1);\n    }\n\n    tes_gs_result = result;\n    OUTPUT_VARIABLE_NAME = INPUT_VARIABLE_NAME;\n}\n\n"
    ;
    break;
  case GEOMETRY_SHADER:
    pcVar5 = 
    "VERSION\n\nlayout(points)                           in;\nlayout(triangle_strip, max_vertices = 4) out;\n\nin  vec4 tes_gs_result[];\nout vec4 gs_fs_result;\n\nin TCSOutputBlock {\n    VARIABLE_DECLARATION;\n} input_block [];\nout GSOutputBlock {\n    VARIABLE_DECLARATION;\n} output_block;\n\nvoid main()\n{\n    vec4 result = vec4(0, 1, 0, 1);\n\nVERIFICATION    else if (vec4(0, 1, 0, 1) != tes_gs_result[0])\n    {\n         result = vec4(1, 0, 0, 1);\n    }\n\n    gs_fs_result = result;\n    OUTPUT_VARIABLE_NAME = INPUT_VARIABLE_NAME;\n    gl_Position  = vec4(-1, -1, 0, 1);\n    EmitVertex();\n    gs_fs_result = result;\n    OUTPUT_VARIABLE_NAME = INPUT_VARIABLE_NAME;\n    gl_Position  = vec4(-1, 1, 0, 1);\n    EmitVertex();\n    gs_fs_result = result;\n    OUTPUT_VARIABLE_NAME = INPUT_VARIABLE_NAME;\n    gl_Position  = vec4(1, -1, 0, 1);\n    EmitVertex();\n    gs_fs_result = result;\n    OUTPUT_VARIABLE_NAME = INPUT_VARIABLE_NAME;\n    gl_Position  = vec4(1, 1, 0, 1);\n    EmitVertex();\n}\n\n"
    ;
    break;
  case FRAGMENT_SHADER:
    pcVar5 = 
    "VERSION\n\nin  vec4 gs_fs_result;\nlayout (location = 0) out vec4 fs_out_result;\n\nin GSOutputBlock {\n    VARIABLE_DECLARATION;\n} input_block;\nout VARIABLE_DECLARATION;\n\nvoid main()\n{\n    vec4 result = vec4(0, 1, 0, 1);\n\nVERIFICATION    else if (vec4(0, 1, 0, 1) != gs_fs_result)\n    {\n         result = vec4(1, 0, 0, 1);\n    }\n\n    fs_out_result = result;\n    OUTPUT_VARIABLE_NAME = INPUT_VARIABLE_NAME;\n}\n\n"
    ;
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
               ,0x18a8);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  uVar3 = (ulong)this->m_current_test_case_index;
  if (this->m_current_test_case_index == 0xffffffff) {
    uVar3 = 0;
  }
  in_qualifiers =
       (this->m_test_cases).
       super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start + uVar3;
  in_test_decl._M_dataplus._M_p = (pointer)&in_test_decl.field_2;
  in_test_decl._M_string_length = 0;
  in_test_decl.field_2._M_local_buf[0] = '\0';
  in_test_ref._M_dataplus._M_p = (pointer)&in_test_ref.field_2;
  in_test_ref._M_string_length = 0;
  in_test_ref.field_2._M_local_buf[0] = '\0';
  out_test_decl._M_dataplus._M_p = (pointer)&out_test_decl.field_2;
  out_test_decl._M_string_length = 0;
  out_test_decl.field_2._M_local_buf[0] = '\0';
  out_test_ref._M_dataplus._M_p = (pointer)&out_test_ref.field_2;
  out_test_ref._M_string_length = 0;
  out_test_ref.field_2._M_local_buf[0] = '\0';
  if (in_stage == VERTEX_SHADER) {
    Utils::prepareVariableStrings
              (VERTEX_SHADER,INPUT,in_qualifiers,"vec4","test",&in_test_decl,&in_test_ref);
  }
  else {
    Utils::prepareBlockVariableStrings
              (in_stage,INPUT,in_qualifiers,"vec4","test","input_block",&in_test_decl,&in_test_ref);
  }
  if (in_stage == FRAGMENT_SHADER) {
    Utils::prepareVariableStrings
              (FRAGMENT_SHADER,OUTPUT,in_qualifiers,"vec4","test",&out_test_decl,&out_test_ref);
  }
  else {
    Utils::prepareBlockVariableStrings
              (in_stage,OUTPUT,in_qualifiers,"vec4","test","output_block",&out_test_decl,
               &out_test_ref);
  }
  if ((in_stage == FRAGMENT_SHADER) &&
     (lVar2 = std::__cxx11::string::find((char *)&out_test_decl,0x1c6484c,0), lVar2 != -1)) {
    uVar3 = std::__cxx11::string::find((char *)&out_test_decl,0x1c6484c,0);
    std::__cxx11::string::erase((ulong)&out_test_decl,uVar3);
  }
  psVar1 = (out_source->m_parts).
           super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar4 = (char *)(psVar1->m_code)._M_string_length;
  strlen(pcVar5);
  std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar4,(ulong)pcVar5);
  position = 0;
  pcVar5 = "#version 420";
  if (in_use_version_400) {
    pcVar5 = 
    "#version 400\n#extension GL_ARB_shading_language_420pack : require\n#extension GL_ARB_separate_shader_objects : enable"
    ;
  }
  pcVar4 = "#version 430";
  if (in_stage != COMPUTE_SHADER) {
    pcVar4 = pcVar5;
  }
  Utils::replaceToken("VERSION",&position,pcVar4,
                      &((out_source->m_parts).
                        super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_code);
  Utils::replaceToken("VARIABLE_DECLARATION",&position,in_test_decl._M_dataplus._M_p,
                      &((out_source->m_parts).
                        super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_code);
  Utils::replaceToken("VARIABLE_DECLARATION",&position,out_test_decl._M_dataplus._M_p,
                      &((out_source->m_parts).
                        super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_code);
  Utils::replaceToken("VERIFICATION",&position,
                      "    vec4 diff = INPUT_VARIABLE_NAME - vec4(0, 0, 1, 1);\n    if (false == all(lessThan(diff, vec4(0.001, 0.001, 0.001, 0.001))))\n    {\n        result = INPUT_VARIABLE_NAME;\n    }\n"
                      ,&((out_source->m_parts).
                         super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_code);
  position = position - 0xb2;
  Utils::replaceAllTokens
            ("OUTPUT_VARIABLE_NAME",out_test_ref._M_dataplus._M_p,
             &((out_source->m_parts).
               super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
               ._M_impl.super__Vector_impl_data._M_start)->m_code);
  Utils::replaceAllTokens
            ("INPUT_VARIABLE_NAME",in_test_ref._M_dataplus._M_p,
             &((out_source->m_parts).
               super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
               ._M_impl.super__Vector_impl_data._M_start)->m_code);
  Utils::replaceAllTokens
            ("LOC_VALUE","1",
             &((out_source->m_parts).
               super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
               ._M_impl.super__Vector_impl_data._M_start)->m_code);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)out_test_ref._M_dataplus._M_p != &out_test_ref.field_2) {
    operator_delete(out_test_ref._M_dataplus._M_p,
                    CONCAT71(out_test_ref.field_2._M_allocated_capacity._1_7_,
                             out_test_ref.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)out_test_decl._M_dataplus._M_p != &out_test_decl.field_2) {
    operator_delete(out_test_decl._M_dataplus._M_p,
                    CONCAT71(out_test_decl.field_2._M_allocated_capacity._1_7_,
                             out_test_decl.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)in_test_ref._M_dataplus._M_p != &in_test_ref.field_2) {
    operator_delete(in_test_ref._M_dataplus._M_p,
                    CONCAT71(in_test_ref.field_2._M_allocated_capacity._1_7_,
                             in_test_ref.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)in_test_decl._M_dataplus._M_p != &in_test_decl.field_2) {
    operator_delete(in_test_decl._M_dataplus._M_p,
                    CONCAT71(in_test_decl.field_2._M_allocated_capacity._1_7_,
                             in_test_decl.field_2._M_local_buf[0]) + 1);
  }
switchD_009e510c_caseD_0:
  return;
}

Assistant:

void QualifierOrderBlockTest::prepareShaderSource(Utils::SHADER_STAGES in_stage, bool in_use_version_400,
												  Utils::shaderSource& out_source)
{
	static const GLchar* verification_snippet =
		"    vec4 diff = INPUT_VARIABLE_NAME - vec4(0, 0, 1, 1);\n"
		"    if (false == all(lessThan(diff, vec4(0.001, 0.001, 0.001, 0.001))))\n"
		"    {\n"
		"        result = INPUT_VARIABLE_NAME;\n"
		"    }\n";

	static const GLchar* fragment_shader_template = "VERSION\n"
													"\n"
													"in  vec4 gs_fs_result;\n"
													"layout (location = 0) out vec4 fs_out_result;\n"
													"\n"
													"in GSOutputBlock {\n"
													"    VARIABLE_DECLARATION;\n"
													"} input_block;\n"
													"out VARIABLE_DECLARATION;\n"
													"\n"
													"void main()\n"
													"{\n"
													"    vec4 result = vec4(0, 1, 0, 1);\n"
													"\n"
													"VERIFICATION"
													"    else if (vec4(0, 1, 0, 1) != gs_fs_result)\n"
													"    {\n"
													"         result = vec4(1, 0, 0, 1);\n"
													"    }\n"
													"\n"
													"    fs_out_result = result;\n"
													"    OUTPUT_VARIABLE_NAME = INPUT_VARIABLE_NAME;\n"
													"}\n"
													"\n";

	static const GLchar* geometry_shader_template = "VERSION\n"
													"\n"
													"layout(points)                           in;\n"
													"layout(triangle_strip, max_vertices = 4) out;\n"
													"\n"
													"in  vec4 tes_gs_result[];\n"
													"out vec4 gs_fs_result;\n"
													"\n"
													"in TCSOutputBlock {\n"
													"    VARIABLE_DECLARATION;\n"
													"} input_block [];\n"
													"out GSOutputBlock {\n"
													"    VARIABLE_DECLARATION;\n"
													"} output_block;\n"
													"\n"
													"void main()\n"
													"{\n"
													"    vec4 result = vec4(0, 1, 0, 1);\n"
													"\n"
													"VERIFICATION"
													"    else if (vec4(0, 1, 0, 1) != tes_gs_result[0])\n"
													"    {\n"
													"         result = vec4(1, 0, 0, 1);\n"
													"    }\n"
													"\n"
													"    gs_fs_result = result;\n"
													"    OUTPUT_VARIABLE_NAME = INPUT_VARIABLE_NAME;\n"
													"    gl_Position  = vec4(-1, -1, 0, 1);\n"
													"    EmitVertex();\n"
													"    gs_fs_result = result;\n"
													"    OUTPUT_VARIABLE_NAME = INPUT_VARIABLE_NAME;\n"
													"    gl_Position  = vec4(-1, 1, 0, 1);\n"
													"    EmitVertex();\n"
													"    gs_fs_result = result;\n"
													"    OUTPUT_VARIABLE_NAME = INPUT_VARIABLE_NAME;\n"
													"    gl_Position  = vec4(1, -1, 0, 1);\n"
													"    EmitVertex();\n"
													"    gs_fs_result = result;\n"
													"    OUTPUT_VARIABLE_NAME = INPUT_VARIABLE_NAME;\n"
													"    gl_Position  = vec4(1, 1, 0, 1);\n"
													"    EmitVertex();\n"
													"}\n"
													"\n";

	static const GLchar* tess_ctrl_shader_template =
		"VERSION\n"
		"\n"
		"layout(vertices = 1) out;\n"
		"\n"
		"in  vec4 vs_tcs_result[];\n"
		"out vec4 tcs_tes_result[];\n"
		"\n"
		"in VSOutputBlock {\n"
		"    VARIABLE_DECLARATION;\n"
		"} input_block [];\n"
		"out TCSOutputBlock {\n"
		"    VARIABLE_DECLARATION;\n"
		"} output_block [];\n"
		"\n"
		"void main()\n"
		"{\n"
		"    vec4 result = vec4(0, 1, 0, 1);\n"
		"\n"
		"VERIFICATION"
		"    else if (vec4(0, 1, 0, 1) != vs_tcs_result[gl_InvocationID])\n"
		"    {\n"
		"         result = vec4(1, 0, 0, 1);\n"
		"    }\n"
		"\n"
		"    tcs_tes_result[gl_InvocationID] = result;\n"
		"    OUTPUT_VARIABLE_NAME = INPUT_VARIABLE_NAME;\n"
		"\n"
		"    gl_TessLevelOuter[0] = 1.0;\n"
		"    gl_TessLevelOuter[1] = 1.0;\n"
		"    gl_TessLevelOuter[2] = 1.0;\n"
		"    gl_TessLevelOuter[3] = 1.0;\n"
		"    gl_TessLevelInner[0] = 1.0;\n"
		"    gl_TessLevelInner[1] = 1.0;\n"
		"}\n"
		"\n";

	static const GLchar* tess_eval_shader_template = "VERSION\n"
													 "\n"
													 "layout(isolines, point_mode) in;\n"
													 "\n"
													 "in  vec4 tcs_tes_result[];\n"
													 "out vec4 tes_gs_result;\n"
													 "\n"
													 "in TCSOutputBlock {\n"
													 "    VARIABLE_DECLARATION;\n"
													 "} input_block [];\n"
													 "out TCSOutputBlock {\n"
													 "    VARIABLE_DECLARATION;\n"
													 "} output_block;\n"
													 "\n"
													 "void main()\n"
													 "{\n"
													 "    vec4 result = vec4(0, 1, 0, 1);\n"
													 "\n"
													 "VERIFICATION"
													 "    else if (vec4(0, 1, 0, 1) != tcs_tes_result[0])\n"
													 "    {\n"
													 "         result = vec4(1, 0, 0, 1);\n"
													 "    }\n"
													 "\n"
													 "    tes_gs_result = result;\n"
													 "    OUTPUT_VARIABLE_NAME = INPUT_VARIABLE_NAME;\n"
													 "}\n"
													 "\n";

	static const GLchar* vertex_shader_template = "VERSION\n"
												  "\n"
												  "out vec4 vs_tcs_result;\n"
												  "\n"
												  "in VARIABLE_DECLARATION;\n"
												  "out VSOutputBlock {\n"
												  "    VARIABLE_DECLARATION;\n"
												  "} output_block;\n"
												  "\n"
												  "void main()\n"
												  "{\n"
												  "    vec4 result = vec4(0, 1, 0, 1);\n"
												  "\n"
												  "VERIFICATION"
												  "\n"
												  "    vs_tcs_result = result;\n"
												  "    OUTPUT_VARIABLE_NAME = INPUT_VARIABLE_NAME;\n"
												  "}\n"
												  "\n";

	const GLchar* shader_template = 0;

	switch (in_stage)
	{
	case Utils::COMPUTE_SHADER:
		return;
		break;
	case Utils::FRAGMENT_SHADER:
		shader_template = fragment_shader_template;
		break;
	case Utils::GEOMETRY_SHADER:
		shader_template = geometry_shader_template;
		break;
	case Utils::TESS_CTRL_SHADER:
		shader_template = tess_ctrl_shader_template;
		break;
	case Utils::TESS_EVAL_SHADER:
		shader_template = tess_eval_shader_template;
		break;
	case Utils::VERTEX_SHADER:
		shader_template = vertex_shader_template;
		break;
	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	const Utils::qualifierSet& test_case = getCurrentTestCase();

	std::string in_test_decl;
	std::string in_test_ref;
	std::string out_test_decl;
	std::string out_test_ref;

	switch (in_stage)
	{
	case Utils::VERTEX_SHADER:
		Utils::prepareVariableStrings(in_stage, Utils::INPUT, test_case, "vec4", "test", in_test_decl, in_test_ref);
		break;
	default:
		Utils::prepareBlockVariableStrings(in_stage, Utils::INPUT, test_case, "vec4", "test", "input_block",
										   in_test_decl, in_test_ref);
		break;
	}

	switch (in_stage)
	{
	case Utils::FRAGMENT_SHADER:
		Utils::prepareVariableStrings(in_stage, Utils::OUTPUT, test_case, "vec4", "test", out_test_decl, out_test_ref);
		break;
	default:
		Utils::prepareBlockVariableStrings(in_stage, Utils::OUTPUT, test_case, "vec4", "test", "output_block",
										   out_test_decl, out_test_ref);
		break;
	}

	// sample storage qualifier is not a valid qualifier for fragment output
	if (in_stage == Utils::FRAGMENT_SHADER)
	{
		if (out_test_decl.find("sample") != std::string::npos)
			out_test_decl.erase(out_test_decl.find("sample"), 7);
	}
	out_source.m_parts[0].m_code = shader_template;

	size_t position = 0;

	Utils::replaceToken("VERSION", position, getVersionString(in_stage, in_use_version_400),
						out_source.m_parts[0].m_code);

	Utils::replaceToken("VARIABLE_DECLARATION", position, in_test_decl.c_str(), out_source.m_parts[0].m_code);

	Utils::replaceToken("VARIABLE_DECLARATION", position, out_test_decl.c_str(), out_source.m_parts[0].m_code);

	Utils::replaceToken("VERIFICATION", position, verification_snippet, out_source.m_parts[0].m_code);

	position -= strlen(verification_snippet);

	Utils::replaceAllTokens("OUTPUT_VARIABLE_NAME", out_test_ref.c_str(), out_source.m_parts[0].m_code);

	Utils::replaceAllTokens("INPUT_VARIABLE_NAME", in_test_ref.c_str(), out_source.m_parts[0].m_code);

	Utils::replaceAllTokens("LOC_VALUE", "1", out_source.m_parts[0].m_code);
}